

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalUnion::PhysicalUnion
          (PhysicalUnion *this,vector<duckdb::LogicalType,_true> *types,PhysicalOperator *top,
          PhysicalOperator *bottom,idx_t estimated_cardinality,bool allow_out_of_order)

{
  undefined8 *in_RDI;
  byte in_R9B;
  PhysicalOperator *in_stack_ffffffffffffff68;
  PhysicalOperator *pPVar1;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  *in_stack_ffffffffffffff70;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  *this_00;
  idx_t in_stack_ffffffffffffff78;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff80;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  local_68;
  byte local_29;
  
  local_29 = in_R9B & 1;
  pPVar1 = (PhysicalOperator *)&stack0xffffffffffffffb8;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff70,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff68);
  PhysicalOperator::PhysicalOperator
            (pPVar1,(PhysicalOperatorType)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x18c2f33);
  *in_RDI = &PTR__PhysicalUnion_03531ca0;
  *(byte *)(in_RDI + 0x10) = local_29 & 1;
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalOperator&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  pPVar1 = (PhysicalOperator *)(in_RDI + 2);
  this_00 = &local_68;
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalOperator&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)this_00,pPVar1);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back(this_00,(value_type *)pPVar1);
  return;
}

Assistant:

PhysicalUnion::PhysicalUnion(vector<LogicalType> types, PhysicalOperator &top, PhysicalOperator &bottom,
                             idx_t estimated_cardinality, bool allow_out_of_order)
    : PhysicalOperator(PhysicalOperatorType::UNION, std::move(types), estimated_cardinality),
      allow_out_of_order(allow_out_of_order) {
	children.push_back(top);
	children.push_back(bottom);
}